

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O2

void __thiscall cmLBDepend::cmLBDepend(cmLBDepend *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->IncludeFileRegularExpression).regmatch.startp[0] = (char *)0x0;
  (this->IncludeFileRegularExpression).regmatch.endp[0] = (char *)0x0;
  (this->IncludeFileRegularExpression).regmatch.searchstring = (char *)0x0;
  (this->IncludeFileRegularExpression).program = (char *)0x0;
  (this->ComplainFileRegularExpression).regmatch.startp[0] = (char *)0x0;
  (this->ComplainFileRegularExpression).regmatch.endp[0] = (char *)0x0;
  (this->ComplainFileRegularExpression).regmatch.searchstring = (char *)0x0;
  (this->ComplainFileRegularExpression).program = (char *)0x0;
  (this->IncludeDirectories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->IncludeDirectories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->IncludeDirectories).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header;
  (this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->DependInformationMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->DirectoryToFileToPathMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->DirectoryToFileToPathMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->DirectoryToFileToPathMap)._M_t._M_impl.super__Rb_tree_header;
  (this->DirectoryToFileToPathMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->DirectoryToFileToPathMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->DirectoryToFileToPathMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->Verbose = false;
  cmsys::RegularExpression::compile(&this->IncludeFileRegularExpression,"^.*$");
  cmsys::RegularExpression::compile(&this->ComplainFileRegularExpression,"^$");
  return;
}

Assistant:

cmLBDepend()
  {
    this->Verbose = false;
    this->IncludeFileRegularExpression.compile("^.*$");
    this->ComplainFileRegularExpression.compile("^$");
  }